

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O3

string * __thiscall
helics::DelayFilterOperation::getString_abi_cxx11_
          (string *__return_storage_ptr__,DelayFilterOperation *this,string_view property)

{
  long lVar1;
  
  if ((property._M_len == 5) &&
     ((char)*(int *)((long)property._M_str + 4) == 'y' && *(int *)property._M_str == 0x616c6564)) {
    lVar1 = (this->delay)._M_i.internalTimeCode;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (__return_storage_ptr__,vsnprintf,0x148,"%f",
               (double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000));
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DelayFilterOperation::getString(std::string_view property)
{
    if (property == "delay") {
        return std::to_string(delay.load());
    }
    return FilterOperations::getString(property);
}